

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result.hpp
# Opt level: O3

error_type * __thiscall
toml::
result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
::unwrap_err(result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
             *this,source_location loc)

{
  undefined8 *puVar1;
  undefined1 auVar2 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  __impl *local_40;
  string local_38;
  
  if (this->is_ok_ != true) {
    return (error_type *)&this->field_1;
  }
  local_40 = loc._M_impl;
  auVar2 = __cxa_allocate_exception(0x28);
  puVar1 = auVar2._0_8_;
  cxx::to_string_abi_cxx11_(&local_38,(cxx *)&local_40,auVar2._8_8_);
  std::operator+(&local_60,"toml::result: bad unwrap_err",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_38);
  *puVar1 = &PTR__bad_result_access_004d0720;
  puVar1[1] = puVar1 + 3;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p == &local_60.field_2) {
    *(undefined4 *)(puVar1 + 3) = local_60.field_2._M_allocated_capacity._0_4_;
    *(undefined4 *)((long)puVar1 + 0x1c) = local_60.field_2._M_allocated_capacity._4_4_;
    *(undefined4 *)(puVar1 + 4) = local_60.field_2._8_4_;
    *(undefined4 *)((long)puVar1 + 0x24) = local_60.field_2._12_4_;
  }
  else {
    puVar1[1] = local_60._M_dataplus._M_p;
    puVar1[3] = CONCAT44(local_60.field_2._M_allocated_capacity._4_4_,
                         local_60.field_2._M_allocated_capacity._0_4_);
  }
  puVar1[2] = local_60._M_string_length;
  local_60._M_string_length = 0;
  local_60.field_2._M_allocated_capacity._0_4_ =
       local_60.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  __cxa_throw(puVar1,&bad_result_access::typeinfo,bad_result_access::~bad_result_access);
}

Assistant:

error_type& unwrap_err(cxx::source_location loc = cxx::source_location::current())
    {
        if(this->is_ok())
        {
            throw bad_result_access("toml::result: bad unwrap_err" + cxx::to_string(loc));
        }
        return this->fail_.get();
    }